

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_getaddrinfo(char *nodename,char *servname,addrinfo *hints_in,addrinfo **res)

{
  sockaddr *psVar1;
  sockaddr *psVar2;
  addrinfo *paVar3;
  bool bVar4;
  socklen_t sVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  sockaddr_in6 *sin6;
  addrinfo *paVar11;
  addrinfo *paVar12;
  int iVar13;
  addrinfo **ppaVar14;
  addrinfo local_68;
  int local_34;
  
  if (hints_in == (addrinfo *)0x0) {
    local_68.ai_flags = 0;
    local_68.ai_family = 0;
    local_68.ai_socktype = 0;
    local_68.ai_protocol = 0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
  }
  else {
    local_68.ai_flags = hints_in->ai_flags;
    local_68.ai_family = hints_in->ai_family;
    local_68.ai_socktype = hints_in->ai_socktype;
    local_68.ai_protocol = hints_in->ai_protocol;
    local_68.ai_addrlen = hints_in->ai_addrlen;
    local_68._20_4_ = *(undefined4 *)&hints_in->field_0x14;
    local_68.ai_addr = hints_in->ai_addr;
    local_68.ai_canonname = hints_in->ai_canonname;
    local_68.ai_next = hints_in->ai_next;
  }
  if (tested_for_getaddrinfo_hacks == '\0') {
    test_for_getaddrinfo_hacks();
  }
  iVar10 = local_68.ai_socktype;
  iVar13 = -1;
  if ((local_68.ai_socktype == 0 && (servname != (char *)0x0 && (~need_numeric_port_hack_ & 1) == 0)
      ) && (iVar9 = parse_numeric_servname(servname), -1 < iVar9)) {
    if (nodename == (char *)0x0) {
      iVar10 = evutil_getaddrinfo_common_((char *)0x0,servname,&local_68,res,&local_34);
      return iVar10;
    }
    bVar4 = true;
    servname = (char *)0x0;
    iVar13 = iVar9;
  }
  else {
    bVar4 = false;
  }
  if (tested_for_getaddrinfo_hacks == '\0') {
    test_for_getaddrinfo_hacks();
  }
  if (need_socktype_protocol_hack_ == '\x01') {
    if (local_68.ai_protocol == 0) {
      if (iVar10 == 1) {
        local_68.ai_protocol = 6;
      }
      else if (iVar10 == 2) {
        local_68.ai_protocol = 0x11;
      }
    }
    else if (iVar10 == 0) {
      if ((local_68.ai_protocol == 6) || (local_68.ai_protocol == 0x84)) {
        local_68.ai_socktype = 1;
      }
      else if (local_68.ai_protocol == 0x11) {
        local_68.ai_socktype = 2;
      }
    }
  }
  local_68.ai_flags = local_68.ai_flags & 0x7fffffff;
  iVar10 = getaddrinfo(nodename,servname,(addrinfo *)&local_68,(addrinfo **)res);
  if ((bVar4) && (paVar12 = *res, paVar12 != (addrinfo *)0x0)) {
    ppaVar14 = res;
    do {
      psVar1 = ((addrinfo *)paVar12)->ai_addr;
      if ((psVar1 == (sockaddr *)0x0) || ((psVar1->sa_family != 10 && (psVar1->sa_family != 2)))) {
        *ppaVar14 = (addrinfo *)((addrinfo *)paVar12)->ai_next;
        ((addrinfo *)paVar12)->ai_next = (addrinfo *)0x0;
        freeaddrinfo((addrinfo *)paVar12);
      }
      else {
        *(ushort *)psVar1->sa_data = (ushort)iVar13 << 8 | (ushort)iVar13 >> 8;
      }
      paVar12 = (*ppaVar14)->ai_next;
      ppaVar14 = &(*ppaVar14)->ai_next;
    } while (paVar12 != (addrinfo *)0x0);
  }
  if (tested_for_getaddrinfo_hacks == '\0') {
    test_for_getaddrinfo_hacks();
  }
  if (need_socktype_protocol_hack_ == '\x01') {
    for (paVar12 = *res; paVar12 != (addrinfo *)0x0; paVar12 = paVar12->ai_next) {
      evutil_getaddrinfo_infer_protocols(paVar12);
      if ((paVar12->ai_socktype == 0) && (paVar12->ai_protocol == 0)) {
        paVar11 = (addrinfo *)event_mm_malloc_(0x30);
        if (paVar11 == (addrinfo *)0x0) {
          evutil_freeaddrinfo(*res);
          *res = (addrinfo *)0x0;
          return -10;
        }
        iVar13 = paVar12->ai_flags;
        iVar9 = paVar12->ai_family;
        iVar7 = paVar12->ai_socktype;
        iVar8 = paVar12->ai_protocol;
        sVar5 = paVar12->ai_addrlen;
        uVar6 = *(undefined4 *)&paVar12->field_0x14;
        psVar2 = paVar12->ai_addr;
        paVar3 = paVar12->ai_next;
        paVar11->ai_canonname = paVar12->ai_canonname;
        paVar11->ai_next = paVar3;
        paVar11->ai_addrlen = sVar5;
        *(undefined4 *)&paVar11->field_0x14 = uVar6;
        paVar11->ai_addr = psVar2;
        paVar11->ai_flags = iVar13;
        paVar11->ai_family = iVar9;
        paVar11->ai_socktype = iVar7;
        paVar11->ai_protocol = iVar8;
        paVar12->ai_socktype = 1;
        paVar12->ai_protocol = 6;
        paVar11->ai_socktype = 2;
        paVar11->ai_protocol = 0x11;
        paVar11->ai_next = paVar12->ai_next;
        paVar12->ai_next = paVar11;
      }
    }
  }
  return iVar10;
}

Assistant:

int
evutil_getaddrinfo(const char *nodename, const char *servname,
    const struct evutil_addrinfo *hints_in, struct evutil_addrinfo **res)
{
#ifdef USE_NATIVE_GETADDRINFO
	struct evutil_addrinfo hints;
	int portnum=-1, need_np_hack, err;

	if (hints_in) {
		memcpy(&hints, hints_in, sizeof(hints));
	} else {
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = PF_UNSPEC;
	}

#ifndef AI_ADDRCONFIG
	/* Not every system has AI_ADDRCONFIG, so fake it. */
	if (hints.ai_family == PF_UNSPEC &&
	    (hints.ai_flags & EVUTIL_AI_ADDRCONFIG)) {
		evutil_adjust_hints_for_addrconfig_(&hints);
	}
#endif

#ifndef AI_NUMERICSERV
	/* Not every system has AI_NUMERICSERV, so fake it. */
	if (hints.ai_flags & EVUTIL_AI_NUMERICSERV) {
		if (servname && parse_numeric_servname(servname)<0)
			return EVUTIL_EAI_NONAME;
	}
#endif

	/* Enough operating systems handle enough common non-resolve
	 * cases here weirdly enough that we are better off just
	 * overriding them.  For example:
	 *
	 * - Windows doesn't like to infer the protocol from the
	 *   socket type, or fill in socket or protocol types much at
	 *   all.  It also seems to do its own broken implicit
	 *   always-on version of AI_ADDRCONFIG that keeps it from
	 *   ever resolving even a literal IPv6 address when
	 *   ai_addrtype is PF_UNSPEC.
	 */
#ifdef _WIN32
	{
		int tmp_port;
		err = evutil_getaddrinfo_common_(nodename,servname,&hints,
		    res, &tmp_port);
		if (err == 0 ||
		    err == EVUTIL_EAI_MEMORY ||
		    err == EVUTIL_EAI_NONAME)
			return err;
		/* If we make it here, the system getaddrinfo can
		 * have a crack at it. */
	}
#endif

	/* See documentation for need_numeric_port_hack above.*/
	need_np_hack = need_numeric_port_hack() && servname && !hints.ai_socktype
	    && ((portnum=parse_numeric_servname(servname)) >= 0);
	if (need_np_hack) {
		if (!nodename)
			return evutil_getaddrinfo_common_(
				NULL,servname,&hints, res, &portnum);
		servname = NULL;
	}

	if (need_socktype_protocol_hack()) {
		evutil_getaddrinfo_infer_protocols(&hints);
	}

	/* Make sure that we didn't actually steal any AI_FLAGS values that
	 * the system is using.  (This is a constant expression, and should ge
	 * optimized out.)
	 *
	 * XXXX Turn this into a compile-time failure rather than a run-time
	 * failure.
	 */
	EVUTIL_ASSERT((ALL_NONNATIVE_AI_FLAGS & ALL_NATIVE_AI_FLAGS) == 0);

	/* Clear any flags that only libevent understands. */
	hints.ai_flags &= ~ALL_NONNATIVE_AI_FLAGS;

	err = getaddrinfo(nodename, servname, &hints, res);
	if (need_np_hack)
		apply_numeric_port_hack(portnum, res);

	if (need_socktype_protocol_hack()) {
		if (apply_socktype_protocol_hack(*res) < 0) {
			evutil_freeaddrinfo(*res);
			*res = NULL;
			return EVUTIL_EAI_MEMORY;
		}
	}
	return err;
#else
	int port=0, err;
	struct hostent *ent = NULL;
	struct evutil_addrinfo hints;

	if (hints_in) {
		memcpy(&hints, hints_in, sizeof(hints));
	} else {
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = PF_UNSPEC;
	}

	evutil_adjust_hints_for_addrconfig_(&hints);

	err = evutil_getaddrinfo_common_(nodename, servname, &hints, res, &port);
	if (err != EVUTIL_EAI_NEED_RESOLVE) {
		/* We either succeeded or failed.  No need to continue */
		return err;
	}

	err = 0;
	/* Use any of the various gethostbyname_r variants as available. */
	{
#ifdef EVENT__HAVE_GETHOSTBYNAME_R_6_ARG
		/* This one is what glibc provides. */
		char buf[2048];
		struct hostent hostent;
		int r;
		r = gethostbyname_r(nodename, &hostent, buf, sizeof(buf), &ent,
		    &err);
#elif defined(EVENT__HAVE_GETHOSTBYNAME_R_5_ARG)
		char buf[2048];
		struct hostent hostent;
		ent = gethostbyname_r(nodename, &hostent, buf, sizeof(buf),
		    &err);
#elif defined(EVENT__HAVE_GETHOSTBYNAME_R_3_ARG)
		struct hostent_data data;
		struct hostent hostent;
		memset(&data, 0, sizeof(data));
		err = gethostbyname_r(nodename, &hostent, &data);
		ent = err ? NULL : &hostent;
#else
		/* fall back to gethostbyname. */
		/* XXXX This needs a lock everywhere but Windows. */
		ent = gethostbyname(nodename);
#ifdef _WIN32
		err = WSAGetLastError();
#else
		err = h_errno;
#endif
#endif

		/* Now we have either ent or err set. */
		if (!ent) {
			/* XXX is this right for windows ? */
			switch (err) {
			case TRY_AGAIN:
				return EVUTIL_EAI_AGAIN;
			case NO_RECOVERY:
			default:
				return EVUTIL_EAI_FAIL;
			case HOST_NOT_FOUND:
				return EVUTIL_EAI_NONAME;
			case NO_ADDRESS:
#if NO_DATA != NO_ADDRESS
			case NO_DATA:
#endif
				return EVUTIL_EAI_NODATA;
			}
		}

		if (ent->h_addrtype != hints.ai_family &&
		    hints.ai_family != PF_UNSPEC) {
			/* This wasn't the type we were hoping for.  Too bad
			 * we never had a chance to ask gethostbyname for what
			 * we wanted. */
			return EVUTIL_EAI_NONAME;
		}

		/* Make sure we got _some_ answers. */
		if (ent->h_length == 0)
			return EVUTIL_EAI_NODATA;

		/* If we got an address type we don't know how to make a
		   sockaddr for, give up. */
		if (ent->h_addrtype != PF_INET && ent->h_addrtype != PF_INET6)
			return EVUTIL_EAI_FAMILY;

		*res = addrinfo_from_hostent(ent, port, &hints);
		if (! *res)
			return EVUTIL_EAI_MEMORY;
	}

	return 0;
#endif
}